

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.c
# Opt level: O2

void comex_group_finalize(void)

{
  group_link *pgVar1;
  group_link *igroup;
  
  igroup = group_list->next;
  while (igroup != (comex_igroup_t *)0x0) {
    pgVar1 = igroup->next;
    comex_igroup_finalize(igroup);
    free(igroup);
    igroup = pgVar1;
  }
  MPI_Group_free(&group_list->group);
  free(group_list);
  group_list = (comex_igroup_t *)0x0;
  return;
}

Assistant:

void comex_group_finalize()
{
    comex_igroup_t *current_group_list_item = group_list;
    comex_igroup_t *previous_group_list_item = NULL;

    /* don't free the world group (the list head) */
    current_group_list_item = current_group_list_item->next;

    while (current_group_list_item != NULL) {
        previous_group_list_item = current_group_list_item;
        current_group_list_item = current_group_list_item->next;
        comex_igroup_finalize(previous_group_list_item);
        free(previous_group_list_item);
    }

    /* ok, now free the world group, but not the world comm */
    MPI_Group_free(&(group_list->group));
    free(group_list);
    group_list = NULL;
}